

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O0

Color * __thiscall
RayTracer::m_rayTraceing
          (Color *__return_storage_ptr__,RayTracer *this,Vector3 *start,Vector3 *dir,double weight,
          int depth)

{
  bool bVar1;
  Material *pMVar2;
  Color local_118;
  Color local_100;
  Color local_e8;
  Object *local_d0;
  Object *obj;
  Color ret;
  Collision coll;
  int depth_local;
  double weight_local;
  Vector3 *dir_local;
  Vector3 *start_local;
  RayTracer *this_local;
  
  if (weight < 0.05) {
    Scene::getAmbientLightColor(__return_storage_ptr__,this->m_scene);
    return __return_storage_ptr__;
  }
  Scene::findNearestCollision((Collision *)&ret.b,this->m_scene,start,dir);
  bVar1 = Collision::isHit((Collision *)&ret.b);
  if (!bVar1) {
    Scene::getAmbientLightColor(__return_storage_ptr__,this->m_scene);
    return __return_storage_ptr__;
  }
  bVar1 = Collision::atLight((Collision *)&ret.b);
  if (bVar1) {
    Light::getColor(__return_storage_ptr__,(Light *)coll.object);
    return __return_storage_ptr__;
  }
  if (depth < 0xb) {
    Color::Color((Color *)&obj);
    local_d0 = (Object *)ret.b;
    pMVar2 = Object::getMaterial((Object *)ret.b);
    if ((1e-06 < pMVar2->diff) || (pMVar2 = Object::getMaterial(local_d0), 1e-06 < pMVar2->spec)) {
      pMVar2 = Object::getMaterial(local_d0);
      m_calcLocalIllumination(&local_e8,this,(Collision *)&ret.b,pMVar2);
      Color::operator+=((Color *)&obj,&local_e8);
    }
    pMVar2 = Object::getMaterial(local_d0);
    if (1e-06 < pMVar2->refl) {
      pMVar2 = Object::getMaterial(local_d0);
      m_calcReflection(&local_100,this,(Collision *)&ret.b,pMVar2,weight,depth);
      Color::operator+=((Color *)&obj,&local_100);
    }
    pMVar2 = Object::getMaterial(local_d0);
    if (1e-06 < pMVar2->refr) {
      pMVar2 = Object::getMaterial(local_d0);
      m_calcRefraction(&local_118,this,(Collision *)&ret.b,pMVar2,weight,depth);
      Color::operator+=((Color *)&obj,&local_118);
    }
    Color::confine(__return_storage_ptr__,(Color *)&obj);
    return __return_storage_ptr__;
  }
  Scene::getAmbientLightColor(__return_storage_ptr__,this->m_scene);
  return __return_storage_ptr__;
}

Assistant:

Color RayTracer::m_rayTraceing(const Vector3& start, const Vector3& dir, double weight, int depth) const
{
    if (weight < MIN_WEIGHT) return m_scene->getAmbientLightColor();
    Collision coll = m_scene->findNearestCollision(start, dir);
    if (!coll.isHit())
        return m_scene->getAmbientLightColor();
    else if (coll.atLight())
        return coll.light->getColor();
    else if (depth <= MAX_DEPTH)
    {
        Color ret;
        const Object* obj = coll.object;
        if (obj->getMaterial()->diff > Const::EPS || obj->getMaterial()->spec > Const::EPS)
            ret += m_calcLocalIllumination(coll, obj->getMaterial());
        if (obj->getMaterial()->refl > Const::EPS)
            ret += m_calcReflection(coll, obj->getMaterial(), weight, depth);
        if (obj->getMaterial()->refr > Const::EPS)
            ret += m_calcRefraction(coll, obj->getMaterial(), weight, depth);

        return ret.confine();
    }
    else
        return m_scene->getAmbientLightColor();
}